

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O3

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenEnum
          (LobsterGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EnumVal *ev;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  pointer ppEVar8;
  long *local_140;
  long local_130;
  long lStack_128;
  long *local_120;
  undefined8 local_118;
  long local_110;
  undefined8 uStack_108;
  string local_100;
  string *local_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  string local_98;
  string local_78;
  LobsterGenerator *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((enum_def->super_Definition).generated == false) {
    CheckNameSpace(this,&enum_def->super_Definition,code_ptr);
    GenComment(&(enum_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
    EscapeKeyword(&local_100,this,(string *)enum_def);
    puVar2 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x36643f);
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_110 = *plVar3;
      uStack_108 = puVar2[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *plVar3;
      local_120 = (long *)*puVar2;
    }
    local_118 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_130 = *plVar4;
      lStack_128 = plVar3[3];
    }
    else {
      local_130 = *plVar4;
      local_140 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_140);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    local_e0 = code_ptr;
    local_58 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    ppEVar8 = (enum_def->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar8 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        ev = *ppEVar8;
        GenComment(&ev->doc_comment,local_e0,(CommentConfig *)0x0,"    ");
        std::operator+(&local_50,"    ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)enum_def
                      );
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_d8 = &local_c8;
        puVar5 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar5) {
          local_c8 = *puVar5;
          lStack_c0 = plVar3[3];
        }
        else {
          local_c8 = *puVar5;
          local_d8 = (ulong *)*plVar3;
        }
        paVar1 = &local_100.field_2;
        local_d0 = plVar3[1];
        *plVar3 = (long)puVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        EscapeKeyword(&local_78,local_58,&ev->name);
        uVar6 = 0xf;
        if (local_d8 != &local_c8) {
          uVar6 = local_c8;
        }
        if (uVar6 < local_78._M_string_length + local_d0) {
          uVar7 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            uVar7 = local_78.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar7 < local_78._M_string_length + local_d0) goto LAB_002997f3;
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_d8);
        }
        else {
LAB_002997f3:
          puVar2 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_d8,(ulong)local_78._M_dataplus._M_p);
        }
        plVar3 = puVar2 + 2;
        if ((long *)*puVar2 == plVar3) {
          local_a8 = *plVar3;
          uStack_a0 = puVar2[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar3;
          local_b8 = (long *)*puVar2;
        }
        local_b0 = puVar2[1];
        *puVar2 = plVar3;
        puVar2[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
        puVar5 = (ulong *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar5) {
          local_100.field_2._M_allocated_capacity = *puVar5;
          local_100.field_2._8_8_ = plVar3[3];
          local_100._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_100.field_2._M_allocated_capacity = *puVar5;
          local_100._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_100._M_string_length = plVar3[1];
        *plVar3 = (long)puVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        EnumDef::ToString_abi_cxx11_(&local_98,enum_def,ev);
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar1) {
          uVar7 = local_100.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_98._M_string_length + local_100._M_string_length) {
          uVar7 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar7 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar7 < local_98._M_string_length + local_100._M_string_length)
          goto LAB_0029991e;
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_98,0,(char *)0x0,(ulong)local_100._M_dataplus._M_p);
        }
        else {
LAB_0029991e:
          puVar2 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_100,(ulong)local_98._M_dataplus._M_p);
        }
        plVar3 = puVar2 + 2;
        if ((long *)*puVar2 == plVar3) {
          local_110 = *plVar3;
          uStack_108 = puVar2[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *plVar3;
          local_120 = (long *)*puVar2;
        }
        local_118 = puVar2[1];
        *puVar2 = plVar3;
        puVar2[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_120);
        local_140 = &local_130;
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_130 = *plVar4;
          lStack_128 = plVar3[3];
        }
        else {
          local_130 = *plVar4;
          local_140 = (long *)*plVar3;
        }
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_e0,(ulong)local_140);
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130 + 1);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120,local_110 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar1) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        ppEVar8 = ppEVar8 + 1;
      } while (ppEVar8 !=
               (enum_def->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::append((char *)local_e0);
  }
  return;
}

Assistant:

void GenEnum(const EnumDef &enum_def, std::string *code_ptr) {
    if (enum_def.generated) return;
    std::string &code = *code_ptr;
    CheckNameSpace(enum_def, &code);
    GenComment(enum_def.doc_comment, code_ptr, nullptr, "");
    code += "enum " + NormalizedName(enum_def) + ":\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, code_ptr, nullptr, "    ");
      code += "    " + enum_def.name + "_" + NormalizedName(ev) + " = " +
              enum_def.ToString(ev) + "\n";
    }
    code += "\n";
  }